

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_attributes(char **begin,char *end,element_t *element,plutosvg_document_t *document)

{
  byte bVar1;
  hashmap_entry_t *phVar2;
  size_t __nmemb;
  int iVar3;
  byte *pbVar4;
  hashmap_t *phVar5;
  hashmap_entry_t **pphVar6;
  long lVar7;
  byte *pbVar8;
  attribute *paVar9;
  hashmap_entry *phVar10;
  hashmap_entry_t **pphVar11;
  size_t sVar12;
  ulong uVar13;
  hashmap_entry **pphVar14;
  char *it_2;
  size_t sVar15;
  hashmap_entry_t *phVar16;
  char *it;
  byte *pbVar17;
  byte *pbVar18;
  char *it_3;
  size_t sVar19;
  byte *pbVar20;
  int iVar21;
  byte *pbVar22;
  long lVar23;
  bool bVar24;
  
  pbVar18 = (byte *)*begin;
joined_r0x0010402f:
  if ((end <= pbVar18) ||
     (((bVar1 = *pbVar18, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf) && (bVar1 != 0x5f)) &&
      (bVar1 != 0x3a)))) {
    *begin = (char *)pbVar18;
    return true;
  }
  pbVar17 = pbVar18 + 1;
  if (pbVar18 + 1 < end) {
    sVar19 = 1;
    do {
      bVar1 = pbVar18[sVar19];
      if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x3a)) &&
         ((bVar1 != 0x5f && (9 < (byte)(bVar1 - 0x30) && 1 < (byte)(bVar1 - 0x2d))))) {
        iVar3 = lookupid((char *)pbVar18,sVar19,(name_entry_t *)attributeid_table,0x300);
        pbVar22 = pbVar18 + sVar19;
        pbVar18 = pbVar22 + (((long)end - (long)pbVar18) - sVar19);
        goto LAB_0010452d;
      }
      sVar19 = sVar19 + 1;
      pbVar17 = (byte *)end;
    } while ((long)end - (long)pbVar18 != sVar19);
  }
  iVar3 = lookupid((char *)pbVar18,(long)pbVar17 - (long)pbVar18,(name_entry_t *)attributeid_table,
                   0x300);
  goto LAB_001040df;
  while (pbVar20 = pbVar20 + 1, pbVar4 = pbVar18, pbVar20 != pbVar22) {
LAB_00104497:
    pbVar4 = pbVar20;
    if ((0x20 < (ulong)*pbVar20) || ((0x100002600U >> ((ulong)*pbVar20 & 0x3f) & 1) == 0)) break;
  }
LAB_00104316:
  if ((pbVar22 <= pbVar4) || (*pbVar4 != 0x3a)) goto LAB_00104675;
  pbVar4 = pbVar4 + 1;
  pbVar20 = pbVar4;
  if (pbVar4 < pbVar22) {
    do {
      pbVar20 = pbVar4;
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      pbVar4 = pbVar4 + 1;
      pbVar20 = pbVar22;
    } while (pbVar4 != pbVar22);
  }
  pbVar4 = pbVar20;
  if (pbVar20 < pbVar22) {
    do {
      bVar24 = *pbVar4 == 0x3b;
      pbVar8 = pbVar4;
      pbVar18 = pbVar4;
      if (bVar24) break;
      pbVar4 = pbVar4 + 1;
      pbVar8 = pbVar4;
      pbVar18 = pbVar4;
    } while (pbVar4 < pbVar22);
    while (((pbVar20 < pbVar4 && (pbVar8 = pbVar4, (ulong)pbVar4[-1] < 0x21)) &&
           ((0x100002600U >> ((ulong)pbVar4[-1] & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + -1;
      pbVar8 = pbVar20;
    }
  }
  else {
    bVar24 = false;
    pbVar8 = pbVar20;
    pbVar18 = pbVar20;
  }
  if (iVar3 != 0) {
    paVar9 = (attribute *)heap_alloc(document->heap,0x20);
    paVar9->id = iVar3;
    (paVar9->value).data = (char *)pbVar20;
    (paVar9->value).length = (long)((int)pbVar8 - (int)pbVar20);
    paVar9->next = element->attributes;
    element->attributes = paVar9;
  }
  if (((bVar24) && ((ulong)*pbVar18 < 0x3c)) &&
     ((0x800000100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) != 0)) {
    bVar24 = true;
    do {
      pbVar4 = pbVar18;
      if ((0x20 < (ulong)*pbVar18) || ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
      pbVar18 = pbVar18 + 1;
      bVar24 = pbVar18 < pbVar22;
      pbVar4 = pbVar22;
    } while (pbVar18 != pbVar22);
    pbVar18 = pbVar4;
    if ((((bVar24) && (pbVar4 < pbVar22)) && (*pbVar4 == 0x3b)) &&
       (pbVar4 = pbVar4 + 1, pbVar18 = pbVar4, pbVar4 < pbVar22)) {
      do {
        pbVar18 = pbVar4;
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        pbVar4 = pbVar4 + 1;
        pbVar18 = pbVar22;
      } while (pbVar4 != pbVar22);
    }
  }
  if (pbVar22 <= pbVar18) goto LAB_00104675;
  goto LAB_00104275;
  while (pbVar22 = pbVar22 + 1, pbVar17 = pbVar18, pbVar22 != (byte *)end) {
LAB_0010452d:
    pbVar17 = pbVar22;
    if ((0x20 < (ulong)*pbVar22) || ((0x100002600U >> ((ulong)*pbVar22 & 0x3f) & 1) == 0)) break;
  }
LAB_001040df:
  if ((pbVar17 < end) && (*pbVar17 == 0x3d)) {
    pbVar17 = pbVar17 + 1;
    pbVar18 = pbVar17;
    if (pbVar17 < end) {
      do {
        pbVar18 = pbVar17;
        if ((0x20 < (ulong)*pbVar17) || ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
        break;
        pbVar17 = pbVar17 + 1;
        pbVar18 = (byte *)end;
      } while (pbVar17 != (byte *)end);
    }
    if ((pbVar18 < end) && ((bVar1 = *pbVar18, bVar1 == 0x27 || (bVar1 == 0x22)))) {
      pbVar18 = pbVar18 + 1;
      pbVar17 = pbVar18;
      if (pbVar18 < end) {
        do {
          pbVar17 = pbVar18;
          if ((0x20 < (ulong)*pbVar18) || ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0))
          break;
          pbVar18 = pbVar18 + 1;
          pbVar17 = (byte *)end;
        } while (pbVar18 != (byte *)end);
      }
      if (pbVar17 < end) {
        lVar23 = 0;
        while (pbVar17[lVar23] != bVar1) {
          lVar23 = lVar23 + 1;
          if ((long)end - (long)pbVar17 == lVar23) {
            return false;
          }
        }
        pbVar18 = pbVar17 + lVar23;
        pbVar22 = pbVar18;
        if (pbVar17 < pbVar18) {
          pbVar4 = pbVar18 + -lVar23;
          do {
            pbVar22 = pbVar18;
            if ((0x20 < (ulong)pbVar18[-1]) ||
               ((0x100002600U >> ((ulong)pbVar18[-1] & 0x3f) & 1) == 0)) break;
            pbVar18 = pbVar18 + -1;
            pbVar22 = pbVar4;
          } while (pbVar17 < pbVar18);
        }
        if ((element != (element_t *)0x0) && (iVar3 != 0)) {
          iVar21 = (int)((long)pbVar22 - (long)pbVar17);
          if (iVar3 == 0x25) {
            if (0 < iVar21) {
              pbVar22 = pbVar17 + iVar21;
              pbVar18 = pbVar17;
LAB_00104275:
              bVar1 = *pbVar18;
              if (((byte)(bVar1 + 0x9f) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)) {
                pbVar4 = pbVar18 + 1;
                if (pbVar4 < pbVar22) {
                  sVar19 = 1;
                  do {
                    bVar1 = pbVar18[sVar19];
                    if (((0x19 < (byte)(bVar1 + 0x9f)) &&
                        (bVar1 != 0x5f && 0x19 < (byte)(bVar1 + 0xbf))) &&
                       (bVar1 != 0x2d && 9 < (byte)(bVar1 - 0x30))) {
                      iVar3 = lookupid((char *)pbVar18,sVar19,(name_entry_t *)cssattributeid_table,
                                       0x130);
                      pbVar20 = pbVar18 + sVar19;
                      pbVar18 = pbVar20 + (long)(pbVar22 + (-sVar19 - (long)pbVar18));
                      goto LAB_00104497;
                    }
                    lVar7 = sVar19 + 1;
                    sVar19 = sVar19 + 1;
                  } while (pbVar18 + lVar7 < pbVar22);
                  pbVar4 = pbVar18 + sVar19;
                }
                iVar3 = lookupid((char *)pbVar18,(long)pbVar4 - (long)pbVar18,
                                 (name_entry_t *)cssattributeid_table,0x130);
                goto LAB_00104316;
              }
            }
          }
          else if (iVar3 == 0x12) {
            phVar5 = document->id_cache;
            if (phVar5 == (hashmap_t *)0x0) {
              phVar5 = (hashmap_t *)malloc(0x18);
              pphVar6 = (hashmap_entry_t **)calloc(0x10,8);
              phVar5->buckets = pphVar6;
              phVar5->size = 0;
              phVar5->capacity = 0x10;
              document->id_cache = phVar5;
            }
            lVar7 = (long)pbVar22 - (long)pbVar17 << 0x20;
            sVar19 = (size_t)iVar21;
            if (lVar7 == 0) {
              sVar15 = 0;
            }
            else {
              sVar12 = 0;
              sVar15 = sVar19;
              do {
                sVar15 = (long)(char)pbVar17[sVar12] + sVar15 * 0x1f;
                sVar12 = sVar12 + 1;
              } while (sVar19 != sVar12);
            }
            uVar13 = phVar5->capacity - 1 & sVar15;
            phVar2 = phVar5->buckets[uVar13];
            if (phVar2 == (hashmap_entry_t *)0x0) {
              pphVar14 = phVar5->buckets + uVar13;
            }
            else {
              do {
                phVar16 = phVar2;
                if ((phVar16->hash == sVar15) && ((phVar16->name).length == sVar19)) {
                  if (lVar7 == 0) {
LAB_001045ab:
                    phVar16->value = element;
                    goto LAB_00104675;
                  }
                  sVar12 = 0;
                  while (pbVar17[sVar12] == (phVar16->name).data[sVar12]) {
                    sVar12 = sVar12 + 1;
                    if (sVar19 == sVar12) goto LAB_001045ab;
                  }
                }
                phVar2 = phVar16->next;
              } while (phVar16->next != (hashmap_entry *)0x0);
              pphVar14 = &phVar16->next;
            }
            phVar10 = (hashmap_entry *)heap_alloc(document->heap,0x28);
            (phVar10->name).data = (char *)pbVar17;
            (phVar10->name).length = sVar19;
            phVar10->hash = sVar15;
            phVar10->value = element;
            phVar10->next = (hashmap_entry *)0x0;
            *pphVar14 = phVar10;
            sVar19 = phVar5->capacity;
            uVar13 = phVar5->size + 1;
            phVar5->size = uVar13;
            if (sVar19 * 3 >> 2 < uVar13) {
              __nmemb = sVar19 * 2;
              pphVar11 = (hashmap_entry_t **)calloc(__nmemb,8);
              pphVar6 = phVar5->buckets;
              if (sVar19 != 0) {
                sVar15 = 0;
                do {
                  phVar2 = pphVar6[sVar15];
                  while (phVar2 != (hashmap_entry_t *)0x0) {
                    phVar10 = phVar2->next;
                    uVar13 = phVar2->hash & __nmemb - 1;
                    phVar2->next = pphVar11[uVar13];
                    pphVar11[uVar13] = phVar2;
                    phVar2 = phVar10;
                  }
                  sVar15 = sVar15 + 1;
                } while (sVar15 != sVar19);
              }
              free(pphVar6);
              phVar5->buckets = pphVar11;
              phVar5->capacity = __nmemb;
            }
          }
          else {
            paVar9 = (attribute *)heap_alloc(document->heap,0x20);
            paVar9->id = iVar3;
            (paVar9->value).data = (char *)pbVar17;
            (paVar9->value).length = (long)iVar21;
            paVar9->next = element->attributes;
            element->attributes = paVar9;
          }
        }
LAB_00104675:
        pbVar22 = pbVar17 + lVar23 + 1;
        pbVar18 = pbVar22;
        if (pbVar22 < end) {
          pbVar17 = pbVar22 + (((long)end - (long)pbVar17) - lVar23) + -1;
          do {
            pbVar18 = pbVar22;
            if ((0x20 < (ulong)*pbVar22) || ((0x100002600U >> ((ulong)*pbVar22 & 0x3f) & 1) == 0))
            break;
            pbVar22 = pbVar22 + 1;
            pbVar18 = pbVar17;
          } while (pbVar22 != (byte *)end);
        }
        goto joined_r0x0010402f;
      }
    }
  }
  return false;
}

Assistant:

static bool parse_attributes(const char** begin, const char* end, element_t* element, plutosvg_document_t* document)
{
    const char* it = *begin;
    while(it < end && IS_STARTNAMECHAR(*it)) {
        const char* data = it++;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        int id = attributeid(data, it - data);
        skip_ws(&it, end);
        if(it >= end || *it != '=')
            return false;
        ++it;
        skip_ws(&it, end);
        if(it >= end || (*it != '"' && *it != '\''))
            return false;
        const char quote = *it++;
        skip_ws(&it, end);
        data = it;
        while(it < end && *it != quote)
            ++it;
        if(it >= end || *it != quote)
            return false;
        int length = rtrim(data, it) - data;
        if(id && element) {
            if(id == ATTR_ID) {
                if(document->id_cache == NULL)
                    document->id_cache = hashmap_create();
                hashmap_put(document->id_cache, document->heap, data, length, element);
            } else if(id == ATTR_STYLE) {
                parse_style(data, length, element, document);
            } else {
                add_attribute(element, document, id, data, length);
            }
        }

        ++it;
        skip_ws(&it, end);
    }

    *begin = it;
    return true;
}